

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Compiler *this,Module *module,Orphanage orphanage)

{
  Locked<kj::Own<capnp::compiler::Compiler::Impl>_> local_40;
  
  kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
  local_40.ptr = &(this->impl).value;
  local_40.mutex = &(this->impl).mutex;
  Impl::getFileImportTable(__return_storage_ptr__,(this->impl).value.ptr,module,orphanage);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl>_>::~Locked(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::getFileImportTable(Module& module, Orphanage orphanage) const {
  return impl.lockExclusive()->get()->getFileImportTable(module, orphanage);
}